

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> * __thiscall
chaiscript::dispatch::Param_Types::convert
          (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
           *__return_storage_ptr__,Param_Types *this,Function_Params t_params,
          Type_Conversions_State *t_conversions)

{
  pointer pBVar1;
  pointer ppVar2;
  bool bVar3;
  Type_Info *ti;
  ulong uVar4;
  long lVar5;
  long lVar6;
  undefined1 local_78 [32];
  Type_Info dynamic_object_type_info;
  Function_Params t_params_local;
  
  t_params_local.m_end = t_params.m_end;
  t_params_local.m_begin = t_params.m_begin;
  Function_Params::to_vector(__return_storage_ptr__,&t_params_local);
  dynamic_object_type_info.m_type_info = (type_info *)&Dynamic_Object::typeinfo;
  dynamic_object_type_info.m_bare_type_info = (type_info *)&Dynamic_Object::typeinfo;
  dynamic_object_type_info.m_flags = 0;
  lVar5 = 0x20;
  lVar6 = 0;
  for (uVar4 = 0;
      pBVar1 = (__return_storage_ptr__->
               super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(__return_storage_ptr__->
                            super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 4);
      uVar4 = uVar4 + 1) {
    if (*(long *)((long)(this->m_types).
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x18) != 0) {
      bVar3 = Type_Info::bare_equal
                        (*(Type_Info **)
                          ((long)&(pBVar1->m_data).
                                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + lVar6),&dynamic_object_type_info);
      if ((!bVar3) &&
         (ppVar2 = (this->m_types).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         (*(byte *)((long)&(ppVar2->first).field_2 + lVar5) & 0x20) == 0)) {
        ti = (Type_Info *)((long)&(ppVar2->first)._M_dataplus + lVar5);
        bVar3 = Type_Info::bare_equal
                          (*(Type_Info **)
                            ((long)&(pBVar1->m_data).
                                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + lVar6),ti);
        if (!bVar3) {
          bVar3 = Type_Conversions::converts
                            ((t_conversions->m_conversions)._M_data,ti,
                             *(Type_Info **)
                              ((long)&(pBVar1->m_data).
                                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar6));
          if (bVar3) {
            Type_Conversions::boxed_type_conversion
                      ((Type_Conversions *)local_78,
                       (Type_Info *)(t_conversions->m_conversions)._M_data,
                       (Conversion_Saves *)
                       ((long)&(((this->m_types).
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus +
                       lVar5),(Boxed_Value *)(t_conversions->m_saves)._M_data);
            std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&(((__return_storage_ptr__->
                                 super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->m_data).
                               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar6),
                       (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                       local_78);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
          }
        }
      }
    }
    lVar5 = lVar5 + 0x38;
    lVar6 = lVar6 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Boxed_Value> convert(Function_Params t_params, const Type_Conversions_State &t_conversions) const {
        auto vals = t_params.to_vector();
        const auto dynamic_object_type_info = user_type<Dynamic_Object>();
        for (size_t i = 0; i < vals.size(); ++i) {
          const auto &name = m_types[i].first;
          if (!name.empty()) {
            const auto &bv = vals[i];

            if (!bv.get_type_info().bare_equal(dynamic_object_type_info)) {
              const auto &ti = m_types[i].second;
              if (!ti.is_undef()) {
                if (!bv.get_type_info().bare_equal(ti)) {
                  if (t_conversions->converts(ti, bv.get_type_info())) {
                    try {
                      // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
                      // either way, we are not responsible if it doesn't work
                      vals[i] = t_conversions->boxed_type_conversion(m_types[i].second, t_conversions.saves(), vals[i]);
                    } catch (...) {
                      try {
                        // try going the other way
                        vals[i] = t_conversions->boxed_type_down_conversion(m_types[i].second, t_conversions.saves(), vals[i]);
                      } catch (const chaiscript::detail::exception::bad_any_cast &) {
                        throw exception::bad_boxed_cast(bv.get_type_info(), *m_types[i].second.bare_type_info());
                      }
                    }
                  }
                }
              }
            }
          }
        }

        return vals;
      }